

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_statement.cc
# Opt level: O1

void __thiscall
tchecker::typed_if_statement_t::typed_if_statement_t
          (typed_if_statement_t *this,statement_type_t type,
          shared_ptr<const_tchecker::typed_expression_t> *cond,
          shared_ptr<const_tchecker::typed_statement_t> *then_stmt,
          shared_ptr<const_tchecker::typed_statement_t> *else_stmt)

{
  element_type *peVar1;
  element_type *peVar2;
  shared_ptr<const_tchecker::statement_t> local_38;
  shared_ptr<const_tchecker::statement_t> local_28;
  shared_ptr<const_tchecker::expression_t> local_18;
  
  *(undefined ***)&this->super_typed_statement_t = &PTR__typed_statement_t_0021bbe8;
  (this->super_typed_statement_t)._type = type;
  peVar1 = (cond->super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_18.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    local_18.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)((long)&peVar1->field_0x0 + *(long *)(*(long *)peVar1 + -0x38));
  }
  local_18.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (cond->super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>)
          ._M_refcount._M_pi;
  if (local_18.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_18.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_18.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_18.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_18.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  peVar2 = (then_stmt->
           super___shared_ptr<const_tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  if (peVar2 == (element_type *)0x0) {
    local_28.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    local_28.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)((long)&peVar2->field_0x0 + *(long *)(*(long *)peVar2 + -0x38));
  }
  local_28.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (then_stmt->
          super___shared_ptr<const_tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  if (local_28.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_28.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_28.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  peVar2 = (else_stmt->
           super___shared_ptr<const_tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  if (peVar2 == (element_type *)0x0) {
    local_38.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    local_38.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)((long)&peVar2->field_0x0 + *(long *)(*(long *)peVar2 + -0x38));
  }
  local_38.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (else_stmt->
          super___shared_ptr<const_tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  if (local_38.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_38.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_38.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  if_statement_t::if_statement_t
            (&this->super_if_statement_t,&PTR_construction_vtable_56__0021ad48,&local_18,&local_28,
             &local_38);
  if (local_38.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_28.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_18.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  *(undefined8 *)&this->super_typed_statement_t = 0x21ac90;
  *(undefined8 *)&this->super_if_statement_t = 0x21ad00;
  return;
}

Assistant:

typed_if_statement_t::typed_if_statement_t(enum tchecker::statement_type_t type,
                                           std::shared_ptr<tchecker::typed_expression_t const> const & cond,
                                           std::shared_ptr<tchecker::typed_statement_t const> const & then_stmt,
                                           std::shared_ptr<tchecker::typed_statement_t const> const & else_stmt)
    : tchecker::typed_statement_t(type), tchecker::if_statement_t(cond, then_stmt, else_stmt)
{
}